

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvarianceTestInstance::iterate
          (TestStatus *__return_storage_ptr__,InvarianceTestInstance *this)

{
  SpacingMode spacingMode;
  int iVar1;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer commandBuffer;
  VkRenderPass renderPass_00;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  RefData<vk::Handle<(vk::HandleType)17>_> data_03;
  RefData<vk::Handle<(vk::HandleType)23>_> data_04;
  RefData<vk::Handle<(vk::HandleType)16>_> data_05;
  RefData<vk::Handle<(vk::HandleType)24>_> data_06;
  RefData<vk::VkCommandBuffer_s_*> data_07;
  RefData<vk::Handle<(vk::HandleType)18>_> data_08;
  VkFormat VVar4;
  pointer pLVar5;
  bool bVar6;
  deUint32 queueFamilyIndex_00;
  deUint32 stride;
  int iVar7;
  uint uVar8;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  size_type sVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  reference pvVar13;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar14;
  Handle<(vk::HandleType)19> *pHVar15;
  VkBuffer *pVVar16;
  Handle<(vk::HandleType)22> *pHVar17;
  DescriptorSetUpdateBuilder *this_02;
  Handle<(vk::HandleType)17> *pHVar18;
  Handle<(vk::HandleType)24> *pHVar19;
  TestContext *pTVar20;
  TestLog *pTVar21;
  ostream *poVar22;
  MessageBuilder *pMVar23;
  Allocation *pAVar24;
  void *pvVar25;
  VkDeviceMemory VVar26;
  VkDeviceSize VVar27;
  GraphicsPipelineBuilder *pGVar28;
  ProgramCollection<vk::ProgramBinary> *pPVar29;
  ProgramBinary *pPVar30;
  reference pWVar31;
  Handle<(vk::HandleType)16> *pHVar32;
  VkCommandBuffer_s **ppVVar33;
  Handle<(vk::HandleType)23> *pHVar34;
  Handle<(vk::HandleType)18> *pHVar35;
  reference pvVar36;
  int *piVar37;
  const_reference primitivesA;
  TessPrimitiveType TVar38;
  float primitiveType;
  _func_bool_PerPrimitive_ptr_PerPrimitive_ptr *pred;
  allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> *this_03;
  char *pcVar39;
  allocator<char> local_1411;
  string local_1410;
  allocator<char> local_13e9;
  string local_13e8;
  string local_13c8;
  string local_13a8;
  MessageBuilder local_1388;
  byte local_1202;
  allocator<char> local_1201;
  undefined1 local_1200 [6];
  bool compareOk;
  string local_11e0;
  MessageBuilder local_11c0;
  MessageBuilder local_1040;
  PerPrimitive *local_ec0;
  PerPrimitive *prim1;
  __normal_iterator<const_vkt::tessellation::(anonymous_namespace)::PerPrimitive_*,_std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>_>
  local_eb0;
  __normal_iterator<const_vkt::tessellation::(anonymous_namespace)::PerPrimitive_*,_std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>_>
  local_ea8;
  __normal_iterator<const_vkt::tessellation::(anonymous_namespace)::PerPrimitive_*,_std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>_>
  local_ea0;
  undefined1 local_e98 [8];
  PerPrimitiveVec prim0;
  int half;
  string local_e70;
  MessageBuilder local_e50;
  TestLog *local_cd0;
  TestLog *log_1;
  undefined1 local_cb0 [8];
  PerPrimitiveVec primitives;
  deInt32 numPrimitives;
  int numPrimitiveVertices;
  int refNumPrimitives;
  Allocation *local_c80;
  Allocation *resultAlloc;
  undefined1 local_c70 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  VkDeviceSize vertexBufferOffset;
  Allocation *alloc_1;
  allocator<char> local_be9;
  string local_be8;
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  allocator<char> local_b31;
  string local_b30;
  GraphicsPipelineBuilder local_b10;
  Move<vk::Handle<(vk::HandleType)18>_> local_a08;
  RefData<vk::Handle<(vk::HandleType)18>_> local_9e8;
  undefined1 local_9c8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  __normal_iterator<const_vkt::tessellation::Winding_*,_std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>_>
  local_9a0;
  const_iterator windingIter;
  vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> windingCases;
  int programNdx;
  Allocation *alloc;
  TessLevels data [2];
  TessLevels *tessLevels;
  undefined1 local_928 [4];
  int subTessLevelCaseNdx;
  MessageBuilder local_908;
  string local_788;
  int local_764;
  ostringstream local_760 [4];
  int i;
  ostringstream tessLevelsStr;
  TestLog *log;
  PerPrimitiveVec firstPrim;
  LevelCase *levelCase;
  int tessLevelCaseNdx;
  Move<vk::VkCommandBuffer_s_*> local_5b0;
  RefData<vk::VkCommandBuffer_s_*> local_590;
  undefined1 local_570 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_530;
  undefined1 local_510 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)16>_> local_4e8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_4c8;
  undefined1 local_4a8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_480;
  RefData<vk::Handle<(vk::HandleType)23>_> local_460;
  undefined1 local_440 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_400;
  undefined1 local_3e0 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  DescriptorSetUpdateBuilder local_3b0;
  deUint64 local_368;
  undefined1 local_360 [8];
  VkDescriptorBufferInfo resultBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_338;
  RefData<vk::Handle<(vk::HandleType)22>_> local_318;
  undefined1 local_2f8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_2c0;
  RefData<vk::Handle<(vk::HandleType)21>_> local_2a0;
  undefined1 local_280 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_218;
  RefData<vk::Handle<(vk::HandleType)19>_> local_1f8;
  undefined1 local_1d8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_1b0;
  undefined1 local_178 [8];
  Buffer resultBuffer;
  VkDeviceSize resultBufferSizeBytes;
  int resultBufferTessCoordsOffset;
  int resultBufferMaxVertices;
  undefined1 local_f8 [8];
  Buffer vertexBuffer;
  VkDeviceSize vertexDataSizeBytes;
  deUint32 vertexStride;
  VkFormat vertexFormat;
  int primitiveCount;
  int levelNdx;
  vector<int,_std::allocator<int>_> local_98;
  int local_7c;
  undefined1 local_78 [4];
  int caseNdx;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  primitiveCounts;
  int maxNumPrimitivesPerPatch;
  int numPatchesPerDrawCall;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  tessLevelCases;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  InvarianceTestInstance *this_local;
  
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,0xb);
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  tessLevelCases.
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Context::getDefaultAllocator((this->super_TestInstance).m_context);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(&maxNumPrimitivesPerPatch);
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_78);
  for (local_7c = 0; iVar1 = local_7c,
      sVar9 = std::
              vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
              ::size((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                      *)&maxNumPrimitivesPerPatch), iVar1 < (int)sVar9; local_7c = local_7c + 1) {
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_98);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_78,&local_98);
    std::vector<int,_std::allocator<int>_>::~vector(&local_98);
    vertexFormat = VK_FORMAT_UNDEFINED;
    while( true ) {
      VVar4 = vertexFormat;
      pvVar10 = std::
                vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                              *)&maxNumPrimitivesPerPatch,(long)local_7c);
      sVar9 = std::
              vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
              ::size(&pvVar10->levels);
      if ((int)sVar9 <= (int)VVar4) break;
      TVar38 = (this->m_caseDef).primitiveType;
      spacingMode = (this->m_caseDef).spacingMode;
      bVar6 = (this->m_caseDef).usePointMode;
      pvVar10 = std::
                vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                              *)&maxNumPrimitivesPerPatch,(long)local_7c);
      pvVar11 = std::
                vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ::operator[](&pvVar10->levels,(long)(int)vertexFormat);
      pvVar10 = std::
                vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                              *)&maxNumPrimitivesPerPatch,(long)local_7c);
      pvVar12 = std::
                vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ::operator[](&pvVar10->levels,(long)(int)vertexFormat);
      vertexStride = referencePrimitiveCount
                               (TVar38,spacingMode,(bool)(bVar6 & 1),pvVar11->inner,pvVar12->outer);
      pvVar13 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)local_78);
      std::vector<int,_std::allocator<int>_>::push_back
                (pvVar13,(value_type_conflict1 *)&vertexStride);
      primitiveCounts.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           de::max<int>((int)primitiveCounts.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,vertexStride);
      vertexFormat = vertexFormat + VK_FORMAT_R4G4_UNORM_PACK8;
    }
  }
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(format);
  pLVar5 = tessLevelCases.
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ZEXT48(stride * 0xc);
  makeBufferCreateInfo
            ((VkBufferCreateInfo *)&resultBufferMaxVertices,
             vertexBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,0x80
            );
  tessellation::Buffer::Buffer
            ((Buffer *)local_f8,vk_00,device_00,(Allocator *)pLVar5,
             (VkBufferCreateInfo *)&resultBufferMaxVertices,::vk::MemoryRequirement::HostVisible);
  iVar1 = (int)primitiveCounts.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage * 2;
  iVar7 = numVerticesPerPrimitive
                    ((this->m_caseDef).primitiveType,(bool)((this->m_caseDef).usePointMode & 1));
  pLVar5 = tessLevelCases.
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = (long)(iVar1 * iVar7) << 6 | 0x10;
  makeBufferCreateInfo
            (&local_1b0,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,0x20
            );
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            ((Buffer *)local_178,vk_00,device_00,(Allocator *)pLVar5,&local_1b0,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,8);
  ::vk::DescriptorSetLayoutBuilder::build(&local_218,this_00,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f8,(Move *)&local_218);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_1f8.deleter.m_deviceIface;
  data_00.object.m_internal = local_1f8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1f8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_1f8.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_1f8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_1f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1d8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_218);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_2c0,this_01,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2a0,(Move *)&local_2c0);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_2a0.deleter.m_deviceIface;
  data_01.object.m_internal = local_2a0.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2a0.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_2a0.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_2a0.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_2a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_280,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_2c0);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_280);
  descriptorPool_00.m_internal = pHVar14->m_internal;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1d8);
  resultBufferInfo.range = pHVar15->m_internal;
  makeDescriptorSet(&local_338,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)resultBufferInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_318,(Move *)&local_338);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_318.deleter.m_deviceIface;
  data_02.object.m_internal = local_318.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_318.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_318.deleter.m_device;
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_318.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_318.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2f8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_338);
  pVVar16 = tessellation::Buffer::get((Buffer *)local_178);
  local_368 = pVVar16->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_360,(VkBuffer)local_368,0,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_3b0);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2f8);
  destSet.m_internal = pHVar17->m_internal;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_3b0,destSet,
                       (Location *)
                       &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_360);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_3b0);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator,
             vk_00,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_400,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_400.deleter.m_deviceIface;
  data_03.object.m_internal = local_400.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_400.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_400.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_400.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_400.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3e0,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3e0);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar18->m_internal;
  makeFramebufferWithoutAttachments
            (&local_480,vk_00,device_00,
             (VkRenderPass)
             pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
             m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_460,(Move *)&local_480);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_460.deleter.m_deviceIface;
  data_04.object.m_internal = local_460.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_460.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_460.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_460.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_460.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_440,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_480);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_1d8);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar15->m_internal;
  makePipelineLayout(&local_4e8,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4c8,(Move *)&local_4e8);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_4c8.deleter.m_deviceIface;
  data_05.object.m_internal = local_4c8.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4c8.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_4c8.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_4c8.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_4c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_4a8,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_4e8);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,queueFamilyIndex_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_530,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_530.deleter.m_deviceIface;
  data_06.object.m_internal = local_530.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_530.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_530.deleter.m_device;
  data_06.deleter.m_allocator._0_4_ = (int)local_530.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_530.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_510,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_510);
  ::vk::allocateCommandBuffer
            (&local_5b0,vk_00,device_00,(VkCommandPool)pHVar19->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_590,(Move *)&local_5b0);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_590.deleter.m_deviceIface;
  data_07.object = local_590.object;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_590.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device = local_590.deleter.m_device;
  data_07.deleter.m_pool.m_internal._0_4_ = (int)local_590.deleter.m_pool.m_internal;
  data_07.deleter.m_pool.m_internal._4_4_ = (int)(local_590.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_570,data_07);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_5b0);
  for (levelCase._4_4_ = 0;
      sVar9 = std::
              vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
              ::size((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                      *)&maxNumPrimitivesPerPatch), levelCase._4_4_ < (int)sVar9;
      levelCase._4_4_ = levelCase._4_4_ + 1) {
    firstPrim.
    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                  ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                *)&maxNumPrimitivesPerPatch,(long)levelCase._4_4_);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    ::vector((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              *)&log);
    pTVar20 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar21 = tcu::TestContext::getLog(pTVar20);
    std::__cxx11::ostringstream::ostringstream(local_760);
    local_764 = 0;
    while( true ) {
      iVar1 = local_764;
      sVar9 = std::
              vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
              ::size((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      *)firstPrim.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      TVar38 = (TessPrimitiveType)sVar9;
      if ((int)TVar38 <= iVar1) break;
      sVar9 = std::
              vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
              ::size((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      *)firstPrim.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar39 = "";
      if (1 < sVar9) {
        pcVar39 = "\n";
      }
      poVar22 = std::operator<<((ostream *)local_760,pcVar39);
      pvVar11 = std::
                vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ::operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                              *)firstPrim.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_764);
      getTessellationLevelsString_abi_cxx11_
                (&local_788,(tessellation *)pvVar11,
                 (TessLevels *)(ulong)(this->m_caseDef).primitiveType,TVar38);
      std::operator<<(poVar22,(string *)&local_788);
      std::__cxx11::string::~string((string *)&local_788);
      local_764 = local_764 + 1;
    }
    tcu::TestLog::operator<<(&local_908,pTVar21,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar23 = tcu::MessageBuilder::operator<<(&local_908,(char (*) [26])"Tessellation level sets: ")
    ;
    std::__cxx11::ostringstream::str();
    pMVar23 = tcu::MessageBuilder::operator<<
                        (pMVar23,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_928);
    tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)local_928);
    tcu::MessageBuilder::~MessageBuilder(&local_908);
    std::__cxx11::ostringstream::~ostringstream(local_760);
    for (tessLevels._4_4_ = 0;
        sVar9 = std::
                vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ::size((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                        *)firstPrim.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
        tessLevels._4_4_ < (int)sVar9; tessLevels._4_4_ = tessLevels._4_4_ + 1) {
      data[1].outer._8_8_ =
           std::
           vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
           operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                       *)firstPrim.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)tessLevels._4_4_);
      data[0].outer._0_8_ = *(undefined8 *)(((const_reference)data[1].outer._8_8_)->outer + 2);
      alloc = *(Allocation **)((const_reference)data[1].outer._8_8_)->inner;
      data[0].inner = *(float (*) [2])((const_reference)data[1].outer._8_8_)->outer;
      data[1].outer._0_8_ = *(undefined8 *)(((const_reference)data[1].outer._8_8_)->outer + 2);
      data[0].outer._8_8_ = *(undefined8 *)((const_reference)data[1].outer._8_8_)->inner;
      data[1].inner = *(float (*) [2])((const_reference)data[1].outer._8_8_)->outer;
      pAVar24 = tessellation::Buffer::getAllocation((Buffer *)local_f8);
      pvVar25 = ::vk::Allocation::getHostPtr(pAVar24);
      ::deMemcpy(pvVar25,&alloc,0x30);
      VVar26 = ::vk::Allocation::getMemory(pAVar24);
      VVar27 = ::vk::Allocation::getOffset(pAVar24);
      ::vk::flushMappedMemoryRange(vk_00,device_00,VVar26,VVar27,0x30);
      windingCases.
      super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      getWindingCases((vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                       *)&windingIter,(this->m_caseDef).windingUsage);
      local_9a0._M_current =
           (Winding *)
           std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>::
           begin((vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> *)
                 &windingIter);
      while( true ) {
        pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)
             std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>::
             end((vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> *)
                 &windingIter);
        bVar6 = __gnu_cxx::operator!=
                          (&local_9a0,
                           (__normal_iterator<const_vkt::tessellation::Winding_*,_std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>_>
                            *)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                               deleter.m_allocator);
        if (!bVar6) break;
        GraphicsPipelineBuilder::GraphicsPipelineBuilder(&local_b10);
        pGVar28 = GraphicsPipelineBuilder::setPatchControlPoints(&local_b10,6);
        pGVar28 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                            (pGVar28,VK_FORMAT_R32_SFLOAT,stride);
        pPVar29 = Context::getBinaryCollection((this->super_TestInstance).m_context);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b30,"vert",&local_b31);
        pPVar30 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar29,&local_b30);
        pGVar28 = GraphicsPipelineBuilder::setShader
                            (pGVar28,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar30,
                             (VkSpecializationInfo *)0x0);
        pPVar29 = Context::getBinaryCollection((this->super_TestInstance).m_context);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b58,"tesc",&local_b59);
        pPVar30 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar29,&local_b58);
        pGVar28 = GraphicsPipelineBuilder::setShader
                            (pGVar28,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                             pPVar30,(VkSpecializationInfo *)0x0);
        pPVar29 = Context::getBinaryCollection((this->super_TestInstance).m_context);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,"tese",&local_ba1);
        pWVar31 = __gnu_cxx::
                  __normal_iterator<const_vkt::tessellation::Winding_*,_std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>_>
                  ::operator*(&local_9a0);
        getProgramName(&local_b80,&local_ba0,*pWVar31,(bool)((this->m_caseDef).usePointMode & 1));
        pPVar30 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar29,&local_b80);
        pGVar28 = GraphicsPipelineBuilder::setShader
                            (pGVar28,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                             pPVar30,(VkSpecializationInfo *)0x0);
        pPVar29 = Context::getBinaryCollection((this->super_TestInstance).m_context);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_be8,"geom",&local_be9);
        getProgramName(&local_bc8,&local_be8,(bool)((this->m_caseDef).usePointMode & 1));
        pPVar30 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar29,&local_bc8);
        pGVar28 = GraphicsPipelineBuilder::setShader
                            (pGVar28,vk_00,device_00,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar30,
                             (VkSpecializationInfo *)0x0);
        pHVar32 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_4a8);
        pipelineLayout_00.m_internal = pHVar32->m_internal;
        pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3e0);
        GraphicsPipelineBuilder::build
                  (&local_a08,pGVar28,vk_00,device_00,pipelineLayout_00,
                   (VkRenderPass)pHVar18->m_internal);
        ::vk::refdetails::Move::operator_cast_to_RefData(&local_9e8,(Move *)&local_a08);
        data_08.deleter.m_deviceIface._0_4_ = (int)local_9e8.deleter.m_deviceIface;
        data_08.object.m_internal = local_9e8.object.m_internal;
        data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_9e8.deleter.m_deviceIface >> 0x20);
        data_08.deleter.m_device = local_9e8.deleter.m_device;
        data_08.deleter.m_allocator._0_4_ = (int)local_9e8.deleter.m_allocator;
        data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_9e8.deleter.m_allocator >> 0x20);
        ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
                  ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_9c8,data_08);
        ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_a08);
        std::__cxx11::string::~string((string *)&local_bc8);
        std::__cxx11::string::~string((string *)&local_be8);
        std::allocator<char>::~allocator(&local_be9);
        std::__cxx11::string::~string((string *)&local_b80);
        std::__cxx11::string::~string((string *)&local_ba0);
        std::allocator<char>::~allocator(&local_ba1);
        std::__cxx11::string::~string((string *)&local_b58);
        std::allocator<char>::~allocator(&local_b59);
        std::__cxx11::string::~string((string *)&local_b30);
        std::allocator<char>::~allocator(&local_b31);
        GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_b10);
        pAVar24 = tessellation::Buffer::getAllocation((Buffer *)local_178);
        pvVar25 = ::vk::Allocation::getHostPtr(pAVar24);
        ::deMemset(pvVar25,0,
                   resultBuffer.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                   _8_8_);
        VVar26 = ::vk::Allocation::getMemory(pAVar24);
        VVar27 = ::vk::Allocation::getOffset(pAVar24);
        ::vk::flushMappedMemoryRange
                  (vk_00,device_00,VVar26,VVar27,
                   resultBuffer.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                   _8_8_);
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        beginCommandBuffer(vk_00,*ppVVar33);
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        commandBuffer = *ppVVar33;
        pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3e0);
        renderPass_00.m_internal = pHVar18->m_internal;
        pHVar34 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_440);
        beginRenderPassWithRasterizationDisabled
                  (vk_00,commandBuffer,renderPass_00,(VkFramebuffer)pHVar34->m_internal);
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        pVVar2 = *ppVVar33;
        pHVar35 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_9c8);
        (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,0,pHVar35->m_internal);
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        pVVar2 = *ppVVar33;
        pHVar32 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_4a8);
        dVar3 = pHVar32->m_internal;
        pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2f8);
        (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar2,0,dVar3,0,1,pHVar17,0,0);
        shaderWriteBarrier.size = 0;
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        pVVar2 = *ppVVar33;
        pVVar16 = tessellation::Buffer::get((Buffer *)local_f8);
        (*vk_00->_vptr_DeviceInterface[0x58])(vk_00,pVVar2,0,1,pVVar16,&shaderWriteBarrier.size);
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar33,0xc,1,0);
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        endRenderPass(vk_00,*ppVVar33);
        pVVar16 = tessellation::Buffer::operator*((Buffer *)local_178);
        resultAlloc = (Allocation *)pVVar16->m_internal;
        makeBufferMemoryBarrier
                  ((VkBufferMemoryBarrier *)local_c70,0x40,0x2000,(VkBuffer)resultAlloc,0,
                   resultBuffer.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                   _8_8_);
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar33,0x8000,0x4000,0,0,0,1,local_c70,0,0);
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        endCommandBuffer(vk_00,*ppVVar33);
        ppVVar33 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             ((RefBase<vk::VkCommandBuffer_s_*> *)local_570);
        submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar33);
        local_c80 = tessellation::Buffer::getAllocation((Buffer *)local_178);
        _numPrimitiveVertices = ::vk::Allocation::getMemory(local_c80);
        VVar27 = ::vk::Allocation::getOffset(local_c80);
        ::vk::invalidateMappedMemoryRange
                  (vk_00,device_00,_numPrimitiveVertices,VVar27,
                   resultBuffer.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                   _8_8_);
        pvVar13 = std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                *)local_78,(long)levelCase._4_4_);
        pvVar36 = std::vector<int,_std::allocator<int>_>::operator[](pvVar13,(long)tessLevels._4_4_)
        ;
        numPrimitives = *pvVar36 * 2;
        numVerticesPerPrimitive
                  ((this->m_caseDef).primitiveType,(bool)((this->m_caseDef).usePointMode & 1));
        piVar37 = (int *)::vk::Allocation::getHostPtr(local_c80);
        iVar1 = *piVar37;
        primitives.
        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar1;
        pvVar25 = ::vk::Allocation::getHostPtr(local_c80);
        pred = (_func_bool_PerPrimitive_ptr_PerPrimitive_ptr *)0x10;
        readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
                  ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    *)&log_1,iVar1,pvVar25,0x10,0x40);
        sorted<vkt::tessellation::(anonymous_namespace)::PerPrimitive,bool(*)(vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&,vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&)>
                  ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    *)local_cb0,(tessellation *)&log_1,
                   (vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    *)byPatchPrimitiveID,pred);
        std::
        vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ::~vector((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   *)&log_1);
        pTVar20 = Context::getTestContext((this->super_TestInstance).m_context);
        local_cd0 = tcu::TestContext::getLog(pTVar20);
        if (primitives.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == numPrimitives) {
          sVar9 = std::
                  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ::size((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          *)local_cb0);
          prim0.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)(sVar9 >> 1);
          local_ea0._M_current =
               (PerPrimitive *)
               std::
               vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
               ::begin((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        *)local_cb0);
          local_eb0._M_current =
               (PerPrimitive *)
               std::
               vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
               ::begin((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        *)local_cb0);
          local_ea8 = __gnu_cxx::
                      __normal_iterator<const_vkt::tessellation::(anonymous_namespace)::PerPrimitive_*,_std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>_>
                      ::operator+(&local_eb0,
                                  (long)prim0.
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          this_03 = (allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> *)
                    ((long)&prim1 + 7);
          std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>::allocator(this_03)
          ;
          std::
          vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>>
          ::
          vector<__gnu_cxx::__normal_iterator<vkt::tessellation::(anonymous_namespace)::PerPrimitive_const*,std::vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>>>,void>
                    ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>>
                      *)local_e98,local_ea0,local_ea8,this_03);
          TVar38 = (TessPrimitiveType)this_03;
          std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>::~allocator
                    ((allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive> *)
                     ((long)&prim1 + 7));
          local_ec0 = std::
                      vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                    *)local_cb0,
                                   (long)prim0.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          primitivesA = std::
                        vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                      *)local_e98,0);
          bVar6 = comparePrimitivesExact
                            (primitivesA,local_ec0,
                             prim0.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          if (bVar6) {
            if ((windingCases.
                 super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) &&
               (tessLevels._4_4_ == 0)) {
              std::
              vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ::operator=((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           *)&log,(vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                   *)local_e98);
            }
            else {
              primitiveType =
                   (firstPrim.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->tessCoord[0].m_data[2];
              uVar8 = (*(this->super_TestInstance)._vptr_TestInstance[4])(this,&log,local_e98);
              local_1202 = (byte)uVar8 & 1;
              if ((uVar8 & 1) == 0) {
                tcu::TestLog::operator<<
                          (&local_1388,local_cd0,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar23 = tcu::MessageBuilder::operator<<
                                    (&local_1388,
                                     (char (*) [99])
                                     "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
                                    );
                pMVar23 = tcu::MessageBuilder::operator<<
                                    (pMVar23,(char (*) [45])
                                             "  - case A: program 0, tessellation levels: ");
                pvVar10 = std::
                          vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                          ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                        *)&maxNumPrimitivesPerPatch,(long)levelCase._4_4_);
                pvVar11 = std::
                          vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ::operator[](&pvVar10->levels,0);
                getTessellationLevelsString_abi_cxx11_
                          (&local_13a8,(tessellation *)pvVar11,
                           (TessLevels *)(ulong)(this->m_caseDef).primitiveType,
                           (TessPrimitiveType)primitiveType);
                pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_13a8);
                pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [2])0x1387264);
                pMVar23 = tcu::MessageBuilder::operator<<
                                    (pMVar23,(char (*) [21])"  - case B: program ");
                pMVar23 = tcu::MessageBuilder::operator<<
                                    (pMVar23,(int *)((long)&windingCases.
                                                                                                                        
                                                  super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [24])0x1379de6);
                getTessellationLevelsString_abi_cxx11_
                          (&local_13c8,(tessellation *)data[1].outer._8_8_,
                           (TessLevels *)(ulong)(this->m_caseDef).primitiveType,
                           (TessPrimitiveType)primitiveType);
                pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_13c8);
                tcu::MessageBuilder::operator<<
                          (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::string::~string((string *)&local_13c8);
                std::__cxx11::string::~string((string *)&local_13a8);
                tcu::MessageBuilder::~MessageBuilder(&local_1388);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_13e8,"Invalid set of primitives",&local_13e9);
                tcu::TestStatus::fail(__return_storage_ptr__,&local_13e8);
                std::__cxx11::string::~string((string *)&local_13e8);
                std::allocator<char>::~allocator(&local_13e9);
                bVar6 = true;
                goto LAB_00e0830a;
              }
            }
            bVar6 = false;
          }
          else {
            tcu::TestLog::operator<<
                      (&local_11c0,local_cd0,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar23 = tcu::MessageBuilder::operator<<
                                (&local_11c0,
                                 (char (*) [87])
                                 "Failure: tessellation coordinates differ between two primitives drawn in one draw call"
                                );
            pTVar21 = tcu::MessageBuilder::operator<<
                                (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::TestLog::operator<<
                      (&local_1040,pTVar21,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar23 = tcu::MessageBuilder::operator<<
                                (&local_1040,
                                 (char (*) [53])
                                 "Note: tessellation levels for both primitives were: ");
            getTessellationLevelsString_abi_cxx11_
                      (&local_11e0,(tessellation *)data[1].outer._8_8_,
                       (TessLevels *)(ulong)(this->m_caseDef).primitiveType,TVar38);
            pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_11e0);
            tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_11e0);
            tcu::MessageBuilder::~MessageBuilder(&local_1040);
            tcu::MessageBuilder::~MessageBuilder(&local_11c0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1200,"Invalid set of primitives",&local_1201);
            tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1200);
            std::__cxx11::string::~string((string *)local_1200);
            std::allocator<char>::~allocator(&local_1201);
            bVar6 = true;
          }
LAB_00e0830a:
          std::
          vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ::~vector((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     *)local_e98);
        }
        else {
          tcu::TestLog::operator<<(&local_e50,local_cd0,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar23 = tcu::MessageBuilder::operator<<(&local_e50,(char (*) [14])"Failure: got ");
          pMVar23 = tcu::MessageBuilder::operator<<
                              (pMVar23,(int *)((long)&primitives.
                                                                                                            
                                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 4));
          pMVar23 = tcu::MessageBuilder::operator<<
                              (pMVar23,(char (*) [27])" primitives, but expected ");
          pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&numPrimitives);
          tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_e50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e70,"Invalid set of primitives",
                     (allocator<char> *)((long)&half + 3));
          tcu::TestStatus::fail(__return_storage_ptr__,&local_e70);
          std::__cxx11::string::~string((string *)&local_e70);
          std::allocator<char>::~allocator((allocator<char> *)((long)&half + 3));
          bVar6 = true;
        }
        std::
        vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
        ::~vector((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   *)local_cb0);
        if (!bVar6) {
          windingCases.
          super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               windingCases.
               super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          bVar6 = false;
        }
        ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
                  ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_9c8);
        if (bVar6) goto LAB_00e083a2;
        __gnu_cxx::
        __normal_iterator<const_vkt::tessellation::Winding_*,_std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>_>
        ::operator++(&local_9a0);
      }
      bVar6 = false;
LAB_00e083a2:
      std::vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>::~vector
                ((vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> *)
                 &windingIter);
      if (bVar6) goto LAB_00e083e8;
    }
    bVar6 = false;
LAB_00e083e8:
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
    ::~vector((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
               *)&log);
    if (bVar6) goto LAB_00e084d6;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1410,"OK",&local_1411);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_1410);
  std::__cxx11::string::~string((string *)&local_1410);
  std::allocator<char>::~allocator(&local_1411);
LAB_00e084d6:
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_570);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_510);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_4a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_440);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3e0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_280);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_1d8);
  tessellation::Buffer::~Buffer((Buffer *)local_178);
  tessellation::Buffer::~Buffer((Buffer *)local_f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_78);
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  ::~vector((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
             *)&maxNumPrimitivesPerPatch);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus InvarianceTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(),
					FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const std::vector<LevelCase>	tessLevelCases				= genTessLevelCases();
	const int						numPatchesPerDrawCall		= 2;
	int								maxNumPrimitivesPerPatch	= 0;  // computed below
	std::vector<std::vector<int> >	primitiveCounts;

	for (int caseNdx = 0; caseNdx < static_cast<int>(tessLevelCases.size()); ++caseNdx)
	{
		primitiveCounts.push_back(std::vector<int>());
		for (int levelNdx = 0; levelNdx < static_cast<int>(tessLevelCases[caseNdx].levels.size()); ++levelNdx)
		{
			const int primitiveCount = referencePrimitiveCount(m_caseDef.primitiveType, m_caseDef.spacingMode, m_caseDef.usePointMode,
															   &tessLevelCases[caseNdx].levels[levelNdx].inner[0], &tessLevelCases[caseNdx].levels[levelNdx].outer[0]);
			primitiveCounts.back().push_back(primitiveCount);
			maxNumPrimitivesPerPatch = de::max(maxNumPrimitivesPerPatch, primitiveCount);
		}
	}

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat     vertexFormat        = VK_FORMAT_R32_SFLOAT;
	const deUint32     vertexStride        = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes = NUM_TESS_LEVELS * numPatchesPerDrawCall * vertexStride;
	const Buffer       vertexBuffer        (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Output buffer: number of primitives and an array of PerPrimitive structures

	const int		   resultBufferMaxVertices		= numPatchesPerDrawCall * maxNumPrimitivesPerPatch * numVerticesPerPrimitive(m_caseDef.primitiveType, m_caseDef.usePointMode);
	const int		   resultBufferTessCoordsOffset = (int)sizeof(deInt32) * 4;
	const VkDeviceSize resultBufferSizeBytes        = resultBufferTessCoordsOffset + resultBufferMaxVertices * sizeof(PerPrimitive);
	const Buffer       resultBuffer                 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	const Unique<VkRenderPass>     renderPass    (makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout               (vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (makeCommandPool                  (vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (allocateCommandBuffer            (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < static_cast<int>(tessLevelCases.size()); ++tessLevelCaseNdx)
	{
		const LevelCase& levelCase = tessLevelCases[tessLevelCaseNdx];
		PerPrimitiveVec  firstPrim;

		{
			tcu::TestLog& log = m_context.getTestContext().getLog();
			std::ostringstream tessLevelsStr;

			for (int i = 0; i < static_cast<int>(levelCase.levels.size()); ++i)
				tessLevelsStr << (levelCase.levels.size() > 1u ? "\n" : "") << getTessellationLevelsString(levelCase.levels[i], m_caseDef.primitiveType);

			log << tcu::TestLog::Message << "Tessellation level sets: " << tessLevelsStr.str() << tcu::TestLog::EndMessage;
		}

		for (int subTessLevelCaseNdx = 0; subTessLevelCaseNdx < static_cast<int>(levelCase.levels.size()); ++subTessLevelCaseNdx)
		{
			const TessLevels& tessLevels = levelCase.levels[subTessLevelCaseNdx];
			{
				TessLevels data[2];
				data[0] = tessLevels;
				data[1] = tessLevels;

				const Allocation& alloc = vertexBuffer.getAllocation();
				deMemcpy(alloc.getHostPtr(), data, sizeof(data));
				flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(data));
			}

			int programNdx = 0;
			const std::vector<Winding> windingCases = getWindingCases(m_caseDef.windingUsage);
			for (std::vector<Winding>::const_iterator windingIter = windingCases.begin(); windingIter != windingCases.end(); ++windingIter)
			{
				const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
					.setPatchControlPoints        (NUM_TESS_LEVELS)
					.setVertexInputSingleAttribute(vertexFormat, vertexStride)
					.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(getProgramName("tese", *windingIter, m_caseDef.usePointMode)), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,                m_context.getBinaryCollection().get(getProgramName("geom", m_caseDef.usePointMode)), DE_NULL)
					.build                        (vk, device, *pipelineLayout, *renderPass));

				{
					const Allocation& alloc = resultBuffer.getAllocation();
					deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
					flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
				}

				beginCommandBuffer(vk, *cmdBuffer);
				beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

				vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
				vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
				{
					const VkDeviceSize vertexBufferOffset = 0ull;
					vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
				}

				vk.cmdDraw(*cmdBuffer, numPatchesPerDrawCall * NUM_TESS_LEVELS, 1u, 0u, 0u);
				endRenderPass(vk, *cmdBuffer);

				{
					const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
						VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

					vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
						0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
				}

				endCommandBuffer(vk, *cmdBuffer);
				submitCommandsAndWait(vk, device, queue, *cmdBuffer);

				// Verify case result
				{
					const Allocation& resultAlloc = resultBuffer.getAllocation();
					invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

					const int				refNumPrimitives     = numPatchesPerDrawCall * primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx];
					const int				numPrimitiveVertices = numVerticesPerPrimitive(m_caseDef.primitiveType, m_caseDef.usePointMode);
					const deInt32			numPrimitives        = *static_cast<deInt32*>(resultAlloc.getHostPtr());
					const PerPrimitiveVec	primitives           = sorted(readInterleavedData<PerPrimitive>(numPrimitives, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(PerPrimitive)),
																		  byPatchPrimitiveID);

					// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
					DE_ASSERT(numPrimitiveVertices * numPrimitives <= resultBufferMaxVertices);
					DE_UNREF(numPrimitiveVertices);

					tcu::TestLog& log = m_context.getTestContext().getLog();

					if (numPrimitives != refNumPrimitives)
					{
						log << tcu::TestLog::Message << "Failure: got " << numPrimitives << " primitives, but expected " << refNumPrimitives << tcu::TestLog::EndMessage;

						return tcu::TestStatus::fail("Invalid set of primitives");
					}

					const int					half  = static_cast<int>(primitives.size() / 2);
					const PerPrimitiveVec		prim0 = PerPrimitiveVec(primitives.begin(), primitives.begin() + half);
					const PerPrimitive* const	prim1 = &primitives[half];

					if (!comparePrimitivesExact(&prim0[0], prim1, half))
					{
							log << tcu::TestLog::Message << "Failure: tessellation coordinates differ between two primitives drawn in one draw call" << tcu::TestLog::EndMessage
								<< tcu::TestLog::Message << "Note: tessellation levels for both primitives were: " << getTessellationLevelsString(tessLevels, m_caseDef.primitiveType) << tcu::TestLog::EndMessage;

							return tcu::TestStatus::fail("Invalid set of primitives");
					}

					if (programNdx == 0 && subTessLevelCaseNdx == 0)
						firstPrim = prim0;
					else
					{
						const bool compareOk = compare(firstPrim, prim0, levelCase.mem);
						if (!compareOk)
						{
							log << tcu::TestLog::Message
								<< "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
								<< "  - case A: program 0, tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx].levels[0], m_caseDef.primitiveType) << "\n"
								<< "  - case B: program " << programNdx << ", tessellation levels: " << getTessellationLevelsString(tessLevels, m_caseDef.primitiveType)
								<< tcu::TestLog::EndMessage;

							return tcu::TestStatus::fail("Invalid set of primitives");
						}
					}
				}
				++programNdx;
			}
		}
	}
	return tcu::TestStatus::pass("OK");
}